

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t *bs,void *workspace,short *offcodeNCount,
                        uint *offcodeMaxValue,void *dict,size_t dictSize)

{
  uint tableLog;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  U32 *pUVar7;
  uint hasZeroWeights;
  uint local_c4;
  void *local_c0;
  uint litlengthLog;
  void *local_b0;
  uint maxSymbolValue;
  
  hasZeroWeights = 1;
  (bs->entropy).huf.repeatMode = HUF_repeat_check;
  maxSymbolValue = 0xff;
  local_c0 = workspace;
  local_b0 = dict;
  sVar1 = HUF_readCTable((HUF_CElt *)bs,&maxSymbolValue,(void *)((long)dict + 8),dictSize - 8,
                         &hasZeroWeights);
  if (hasZeroWeights == 0) {
    (bs->entropy).huf.repeatMode = HUF_repeat_valid;
  }
  sVar2 = 0;
  if (0xfe < maxSymbolValue && sVar1 < 0xffffffffffffff89) {
    sVar2 = sVar1;
  }
  sVar3 = 0xffffffffffffffe2;
  if (0xfe < maxSymbolValue && sVar1 < 0xffffffffffffff89) {
    uVar5 = dictSize + (long)local_b0;
    pvVar6 = (void *)((long)dict + 8 + sVar2);
    sVar1 = FSE_readNCount(offcodeNCount,offcodeMaxValue,&maxSymbolValue,pvVar6,uVar5 - (long)pvVar6
                          );
    if ((sVar1 < 0xffffffffffffff89) && (maxSymbolValue < 9)) {
      sVar2 = FSE_buildCTable_wksp
                        ((bs->entropy).fse.offcodeCTable,offcodeNCount,0x1f,maxSymbolValue,local_c0,
                         0x1800);
      if (sVar2 < 0xffffffffffffff89) {
        pvVar6 = (void *)((long)pvVar6 + sVar1);
        hasZeroWeights = 0x34;
        sVar1 = FSE_readNCount((short *)&maxSymbolValue,&hasZeroWeights,&litlengthLog,pvVar6,
                               uVar5 - (long)pvVar6);
        tableLog = litlengthLog;
        sVar3 = 0xffffffffffffffe2;
        if (litlengthLog < 10 && sVar1 < 0xffffffffffffff89) {
          local_c4 = hasZeroWeights;
          sVar3 = ZSTD_checkDictNCount((short *)&maxSymbolValue,hasZeroWeights,0x34);
          if (sVar3 < 0xffffffffffffff89) {
            sVar2 = FSE_buildCTable_wksp
                              ((bs->entropy).fse.matchlengthCTable,(short *)&maxSymbolValue,local_c4
                               ,tableLog,local_c0,0x1800);
            sVar3 = 0xffffffffffffffe2;
            if (sVar2 < 0xffffffffffffff89) {
              pvVar6 = (void *)((long)pvVar6 + sVar1);
              hasZeroWeights = 0x23;
              sVar1 = FSE_readNCount((short *)&maxSymbolValue,&hasZeroWeights,&litlengthLog,pvVar6,
                                     uVar5 - (long)pvVar6);
              sVar3 = 0xffffffffffffffe2;
              if (litlengthLog < 10 && sVar1 < 0xffffffffffffff89) {
                local_c4 = hasZeroWeights;
                sVar3 = ZSTD_checkDictNCount((short *)&maxSymbolValue,hasZeroWeights,0x23);
                if (sVar3 < 0xffffffffffffff89) {
                  sVar2 = FSE_buildCTable_wksp
                                    ((bs->entropy).fse.litlengthCTable,(short *)&maxSymbolValue,
                                     local_c4,litlengthLog,local_c0,0x1800);
                  sVar3 = 0xffffffffffffffe2;
                  if (sVar2 < 0xffffffffffffff89) {
                    uVar4 = (long)pvVar6 + sVar1 + 0xc;
                    if (uVar5 < uVar4) {
                      sVar3 = 0xffffffffffffffe2;
                    }
                    else {
                      pUVar7 = (U32 *)((long)pvVar6 + sVar1);
                      bs->rep[0] = *pUVar7;
                      bs->rep[1] = pUVar7[1];
                      bs->rep[2] = pUVar7[2];
                      sVar3 = uVar4 - (long)local_b0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return sVar3;
}

Assistant:

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t* bs, void* workspace,
                         short* offcodeNCount, unsigned* offcodeMaxValue,
                         const void* const dict, size_t dictSize)
{
    const BYTE* dictPtr = (const BYTE*)dict;    /* skip magic num and dict ID */
    const BYTE* const dictEnd = dictPtr + dictSize;
    dictPtr += 8;
    bs->entropy.huf.repeatMode = HUF_repeat_check;

    {   unsigned maxSymbolValue = 255;
        unsigned hasZeroWeights = 1;
        size_t const hufHeaderSize = HUF_readCTable((HUF_CElt*)bs->entropy.huf.CTable, &maxSymbolValue, dictPtr,
            dictEnd-dictPtr, &hasZeroWeights);

        /* We only set the loaded table as valid if it contains all non-zero
         * weights. Otherwise, we set it to check */
        if (!hasZeroWeights)
            bs->entropy.huf.repeatMode = HUF_repeat_valid;

        RETURN_ERROR_IF(HUF_isError(hufHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(maxSymbolValue < 255, dictionary_corrupted);
        dictPtr += hufHeaderSize;
    }

    {   unsigned offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted);
        /* Defer checking offcodeMaxValue because we need to know the size of the dictionary content */
        /* fill all offset symbols to avoid garbage at end of table */
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.offcodeCTable,
                offcodeNCount, MaxOff, offcodeLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted);
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted);
        /* Every match length code must have non-zero probability */
        FORWARD_IF_ERROR( ZSTD_checkDictNCount(matchlengthNCount, matchlengthMaxValue, MaxML));
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.matchlengthCTable,
                matchlengthNCount, matchlengthMaxValue, matchlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted);
        /* Every literal length code must have non-zero probability */
        FORWARD_IF_ERROR( ZSTD_checkDictNCount(litlengthNCount, litlengthMaxValue, MaxLL));
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.litlengthCTable,
                litlengthNCount, litlengthMaxValue, litlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted);
    bs->rep[0] = MEM_readLE32(dictPtr+0);
    bs->rep[1] = MEM_readLE32(dictPtr+4);
    bs->rep[2] = MEM_readLE32(dictPtr+8);
    dictPtr += 12;

    return dictPtr - (const BYTE*)dict;
}